

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basictests.cpp
# Opt level: O0

void test64<8ul>(void)

{
  bool bVar1;
  ostream *poVar2;
  void *pvVar3;
  uint64_t uVar4;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  double __x;
  double __x_00;
  double in_XMM1_Qa;
  bool mult_ok;
  bool remainder_ok;
  bool quotient_ok;
  uint64_t n;
  undefined1 in_stack_000000a0 [16];
  ostream *in_stack_000000b8;
  uint64_t local_8;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"(64-bit) testing ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,8);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  local_8 = 1;
  while( true ) {
    if (local_8 == 0) {
      return;
    }
    if (local_8 == 1000000) {
      local_8 = 0xfffffffffff0bdbf;
    }
    uVar4 = fast_division::divide64<8UL>::quotient(local_8);
    fast_division::divide64<8UL>::remainder(__x,in_XMM1_Qa);
    bVar1 = fast_division::divide64<8UL>::is_divisible(local_8);
    if (((uVar4 != local_8 >> 3) || (extraout_RAX != (local_8 & 7))) ||
       (bVar1 != ((local_8 & 7) == 0))) break;
    local_8 = local_8 + 1;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"problem with n = ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,local_8);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"quotient: ");
  uVar4 = fast_division::divide64<8UL>::quotient(local_8);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar4);
  poVar2 = std::operator<<(poVar2," expected: ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,local_8 >> 3);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"remainder: ");
  fast_division::divide64<8UL>::remainder(__x_00,in_XMM1_Qa);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,extraout_RAX_00);
  poVar2 = std::operator<<(poVar2," expected: ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,(ulong)((uint)local_8 & 7));
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"multiple: ");
  bVar1 = fast_division::divide64<8UL>::is_divisible(local_8);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,bVar1);
  poVar2 = std::operator<<(poVar2," expected: ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,(local_8 & 7) == 0);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"need_fallback = ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,false);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"is_power_2    = ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,true);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"c             = ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,1);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"leading_zeroes= ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,0x3c);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"log2_divisor  = ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,3);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"m             = ");
  poVar2 = operator<<(in_stack_000000b8,(__uint128_t)in_stack_000000a0);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"overflow      = ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,false);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  abort();
}

Assistant:

void test64() {
  std::cout << "(64-bit) testing " << divisor << std::endl;
  for (uint64_t n = 1; n != 0; n++) {
    if (n == 1000000) {
      n = 0xFFFFFFFFFFFFFFFF - 1000000;
    }
    bool quotient_ok =
        fast_division::divide64<divisor>::quotient(n) == n / divisor;
    bool remainder_ok =
        fast_division::divide64<divisor>::remainder(n) == n % divisor;
    bool mult_ok =
        fast_division::divide64<divisor>::is_divisible(n) == (n % divisor == 0);
    if (!quotient_ok || !remainder_ok || !mult_ok) {
      std::cerr << "problem with n = " << n << std::endl;
      std::cout << "quotient: " << fast_division::divide64<divisor>::quotient(n)
                << " expected: " << n / divisor << std::endl;
      std::cout << "remainder: "
                << fast_division::divide64<divisor>::remainder(n)
                << " expected: " << n % divisor << std::endl;
      std::cout << "multiple: "
                << fast_division::divide64<divisor>::is_divisible(n)
                << " expected: " << (n % divisor == 0) << std::endl;

      std::cout << "need_fallback = "
                << fast_division::divide64<divisor>::need_fallback << std::endl;
      std::cout << "is_power_2    = "
                << fast_division::divide64<divisor>::is_power_2 << std::endl;
      std::cout << "c             = " << fast_division::divide64<divisor>::c
                << std::endl;
      std::cout << "leading_zeroes= "
                << fast_division::divide64<divisor>::leading_zeroes
                << std::endl;
      std::cout << "log2_divisor  = "
                << fast_division::divide64<divisor>::log2_divisor << std::endl;
      std::cout << "m             = " << fast_division::divide64<divisor>::m
                << std::endl;
      std::cout << "overflow      = "
                << fast_division::divide64<divisor>::overflow << std::endl;

      abort();
    }
  }
}